

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_remove_music.hpp
# Opt level: O2

void __thiscall PatchRemoveMusic::alter_rom(PatchRemoveMusic *this,ROM *rom)

{
  uint32_t addr;
  uint32_t address;
  
  for (address = 0x2a32; address != 0x2a44; address = address + 1) {
    md::ROM::set_byte(rom,address,' ');
  }
  md::ROM::set_byte(rom,0x9e59a,' ');
  md::ROM::set_byte(rom,0x155eb,' ');
  md::ROM::set_byte(rom,0x27721,' ');
  md::ROM::set_byte(rom,0x15523,' ');
  md::ROM::set_byte(rom,0x9ebe3,' ');
  md::ROM::set_byte(rom,0x9d6a1,' ');
  md::ROM::set_byte(rom,0x9d747,' ');
  md::ROM::set_byte(rom,0x9e195,' ');
  md::ROM::set_byte(rom,0x9e2c1,' ');
  md::ROM::set_byte(rom,0x9e57c,' ');
  return;
}

Assistant:

void alter_rom(md::ROM& rom) override
    {
        // Empty the RoomMusicLUT
        for(uint32_t addr=0x2A32 ; addr < 0x2A44 ; ++addr)
            rom.set_byte(addr, MUSIC_SILENT);

        // Remove cutscene-triggered music
        rom.set_byte(0x9E59A, MUSIC_SILENT); // Duke Fanfare before last boss
        rom.set_byte(0x155EB, MUSIC_SILENT); // Last boss cutscene
        rom.set_byte(0x27721, MUSIC_SILENT); // Last boss cutscene
        rom.set_byte(0x15523, MUSIC_SILENT); // Last boss music
        rom.set_byte(0x9EBE3, MUSIC_SILENT); // Credits music

        // Remove boss musics
        rom.set_byte(0x9D6A1, MUSIC_SILENT);
        rom.set_byte(0x9D747, MUSIC_SILENT);
        rom.set_byte(0x9E195, MUSIC_SILENT);
        rom.set_byte(0x9E2C1, MUSIC_SILENT);
        rom.set_byte(0x9E57C, MUSIC_SILENT);
    }